

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level.c
# Opt level: O1

void update_ref_buffers(DECODER_MODEL *decoder_model,int idx,int refresh_frame_flags)

{
  int i;
  long lVar1;
  
  lVar1 = 0;
  do {
    if (((uint)refresh_frame_flags >> ((uint)lVar1 & 0x1f) & 1) != 0) {
      if ((long)decoder_model->vbi[lVar1] != -1) {
        decoder_model->frame_buffer_pool[decoder_model->vbi[lVar1]].decoder_ref_count =
             decoder_model->frame_buffer_pool[decoder_model->vbi[lVar1]].decoder_ref_count + -1;
      }
      decoder_model->vbi[lVar1] = idx;
      decoder_model->frame_buffer_pool[(uint)idx].decoder_ref_count =
           decoder_model->frame_buffer_pool[(uint)idx].decoder_ref_count + 1;
    }
    lVar1 = lVar1 + 1;
  } while (lVar1 != 8);
  return;
}

Assistant:

static void update_ref_buffers(DECODER_MODEL *const decoder_model, int idx,
                               int refresh_frame_flags) {
  FRAME_BUFFER *const this_buffer = &decoder_model->frame_buffer_pool[idx];
  for (int i = 0; i < REF_FRAMES; ++i) {
    if (refresh_frame_flags & (1 << i)) {
      const int pre_idx = decoder_model->vbi[i];
      if (pre_idx != -1) {
        --decoder_model->frame_buffer_pool[pre_idx].decoder_ref_count;
      }
      decoder_model->vbi[i] = idx;
      ++this_buffer->decoder_ref_count;
    }
  }
}